

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O3

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
           *__return_storage_ptr__,BufferBase *this,
          vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions,VkAccessFlags src_access_mask
          ,VkAccessFlags dst_access_mask,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  pointer pVVar1;
  VkBuffer pVVar2;
  VkDeviceSize *pVVar3;
  long lVar4;
  ulong uVar5;
  VkDeviceSize *pVVar6;
  uint uVar7;
  ulong uVar8;
  allocator_type local_39;
  BufferBase *local_38;
  
  local_38 = this;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_39);
  pVVar1 = (regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar4 != 0) {
    uVar5 = (lVar4 >> 3) * -0x5555555555555555;
    pVVar2 = local_38->m_buffer;
    pVVar6 = &((__return_storage_ptr__->
               super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>).
               _M_impl.super__Vector_impl_data._M_start)->size;
    pVVar3 = &pVVar1->size;
    uVar7 = 1;
    do {
      ((VkBufferMemoryBarrier *)(pVVar6 + -6))->sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
      *pVVar6 = *pVVar3;
      pVVar6[-2] = (VkDeviceSize)pVVar2;
      pVVar6[-1] = ((VkBufferCopy *)(pVVar3 + -2))->srcOffset;
      *(VkAccessFlags *)(pVVar6 + -4) = src_access_mask;
      *(VkAccessFlags *)((long)pVVar6 + -0x1c) = dst_access_mask;
      *(uint32_t *)(pVVar6 + -3) = src_queue_family;
      *(uint32_t *)((long)pVVar6 + -0x14) = dst_queue_family;
      uVar8 = (ulong)uVar7;
      pVVar6 = pVVar6 + 7;
      pVVar3 = pVVar3 + 3;
      uVar7 = uVar7 + 1;
    } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = regions[i].size;

		cur.buffer = m_buffer;
		cur.offset = regions[i].srcOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}